

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O1

error_info * __thiscall
toml::detail::make_error_info_rec<toml::source_location,char_const(&)[21]>
          (error_info *__return_storage_ptr__,detail *this,error_info *e,source_location *loc,
          string *msg,source_location *tail,char (*tail_1) [21])

{
  size_type *psVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  error_info local_1a0;
  string local_148;
  pointer local_128;
  size_type sStack_120;
  size_type local_118;
  size_t sStack_110;
  pointer local_108;
  size_type sStack_100;
  size_type local_f8;
  size_t sStack_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pointer local_c8;
  pointer pbStack_c0;
  pointer local_b8;
  pointer local_a8;
  size_type sStack_a0;
  size_type local_98;
  size_t sStack_90;
  pointer local_88;
  pointer ppStack_80;
  pointer local_78;
  pointer pcStack_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_a8 = (e->title_)._M_dataplus._M_p;
  sStack_a0 = (e->title_)._M_string_length;
  local_98 = (e->title_).field_2._M_allocated_capacity;
  sStack_90 = *(size_t *)((long)&(e->title_).field_2 + 8);
  local_88 = (e->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppStack_80 = (e->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = (e->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcStack_70 = (e->suffix_)._M_dataplus._M_p;
  local_68._M_p = (pointer)&local_58;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(e->suffix_)._M_string_length;
  psVar1 = (size_type *)((long)&(e->suffix_).field_2 + 8);
  if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
    local_58._M_allocated_capacity = *psVar1;
    local_58._8_8_ = e[1].title_._M_dataplus._M_p;
  }
  else {
    local_58._M_allocated_capacity = *psVar1;
    local_68._M_p = (pointer)paVar5;
  }
  local_60 = (e->suffix_).field_2._M_allocated_capacity;
  (e->suffix_)._M_string_length = (size_type)psVar1;
  (e->suffix_).field_2._M_allocated_capacity = 0;
  (e->suffix_).field_2._M_local_buf[8] = '\0';
  local_48 = (pointer)e[1].title_._M_string_length;
  pbStack_40 = (pointer)e[1].title_.field_2._M_allocated_capacity;
  local_38 = *(pointer *)((long)&e[1].title_.field_2 + 8);
  *(undefined8 *)((long)&e[1].title_.field_2 + 8) = 0;
  e[1].title_._M_string_length = 0;
  e[1].title_.field_2._M_allocated_capacity = 0;
  psVar2 = &loc->first_column_;
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)loc ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_1c0.field_2._M_allocated_capacity = *psVar2;
    local_1c0.field_2._8_8_ = loc->first_offset_;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar2;
    local_1c0._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)loc;
  }
  local_1c0._M_string_length = loc->first_line_;
  *(size_t **)loc = psVar2;
  loc->first_line_ = 0;
  *(undefined1 *)&loc->first_column_ = 0;
  std::
  vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
  ::emplace_back<toml::source_location,std::__cxx11::string>
            ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
              *)(this + 0x20),(source_location *)&local_a8,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)&local_a8);
  paVar5 = &local_1a0.title_.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)this == paVar3) {
    local_1a0.title_.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_1a0.title_.field_2._8_8_ = *(undefined8 *)(this + 0x18);
    local_1a0.title_._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_1a0.title_.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_1a0.title_._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)this;
  }
  local_1a0.title_._M_string_length = *(size_type *)(this + 8);
  paVar4 = &local_1a0.suffix_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)this = paVar3;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (detail)0x0;
  local_1a0.locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this + 0x20);
  local_1a0.locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this + 0x28);
  local_1a0.locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(this + 0x30);
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x48);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 0x38) == paVar3) {
    local_1a0.suffix_.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_1a0.suffix_.field_2._8_8_ = *(undefined8 *)(this + 0x50);
    local_1a0.suffix_._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_1a0.suffix_.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_1a0.suffix_._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 0x38);
  }
  local_1a0.suffix_._M_string_length = *(size_type *)(this + 0x40);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 0x38) = paVar3;
  *(undefined8 *)(this + 0x40) = 0;
  this[0x48] = (detail)0x0;
  local_128 = (msg->_M_dataplus)._M_p;
  sStack_120 = msg->_M_string_length;
  local_118 = (msg->field_2)._M_allocated_capacity;
  sStack_110 = *(size_t *)((long)&msg->field_2 + 8);
  local_108 = msg[1]._M_dataplus._M_p;
  sStack_100 = msg[1]._M_string_length;
  local_f8 = msg[1].field_2._M_allocated_capacity;
  sStack_f0 = *(size_t *)((long)&msg[1].field_2 + 8);
  local_e8._M_p = (pointer)&local_d8;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)msg[2]._M_dataplus._M_p;
  paVar3 = &msg[2].field_2;
  if (paVar6 == paVar3) {
    local_d8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_d8._8_8_ = *(undefined8 *)((long)&msg[2].field_2 + 8);
  }
  else {
    local_d8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_e8._M_p = (pointer)paVar6;
  }
  local_e0 = msg[2]._M_string_length;
  msg[2]._M_dataplus._M_p = (pointer)paVar3;
  msg[2]._M_string_length = 0;
  msg[2].field_2._M_local_buf[0] = '\0';
  local_c8 = (pointer)msg[3]._M_dataplus._M_p;
  pbStack_c0 = (pointer)msg[3]._M_string_length;
  local_b8 = (pointer)msg[3].field_2._M_allocated_capacity;
  msg[3].field_2._M_allocated_capacity = 0;
  msg[3]._M_dataplus._M_p = (pointer)0x0;
  msg[3]._M_string_length = 0;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  sVar7 = strlen(&tail->is_ok_);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,tail,&tail->is_ok_ + sVar7);
  make_error_info_rec<>(__return_storage_ptr__,&local_1a0,(source_location *)&local_128,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.suffix_._M_dataplus._M_p != paVar4) {
    operator_delete(local_1a0.suffix_._M_dataplus._M_p,
                    local_1a0.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1a0.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.title_._M_dataplus._M_p != paVar5) {
    operator_delete(local_1a0.title_._M_dataplus._M_p,
                    local_1a0.title_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info_rec(error_info e,
        source_location loc, std::string msg, Ts&& ... tail)
{
    e.add_locations(std::move(loc), std::move(msg));
    return make_error_info_rec(std::move(e), std::forward<Ts>(tail)...);
}